

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu.h
# Opt level: O1

void floaxie::digit_gen_select<false>::gen<float,char>
               (diy_fp<float,_floaxie::diy_fp_traits<float>_> *Mp,
               diy_fp<float,_floaxie::diy_fp_traits<float>_> *Mm,char *buffer,int *len,int *K)

{
  int iVar1;
  uchar uVar2;
  byte bVar3;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> dVar4;
  kappa_pair_type kVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint n;
  int iVar11;
  
  if (0 < Mp->m_e) {
    __assert_fail("Mp.exponent() <= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/floaxie/floaxie/grisu.h"
                  ,0x7e,
                  "static void floaxie::digit_gen_select<false>::gen(const diy_fp<FloatType> &, const diy_fp<FloatType> &, CharType *, int *, int *) [FloatType = float, CharType = char]"
                 );
  }
  dVar4 = diy_fp<float,_floaxie::diy_fp_traits<float>_>::operator-(Mp,Mm);
  if (0x1f < (uint)-Mp->m_e) {
    __assert_fail("power < bit_size<NumericType>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/floaxie/floaxie/bit_ops.h"
                  ,0x3e,"NumericType floaxie::raised_bit(std::size_t) [NumericType = unsigned int]")
    ;
  }
  uVar9 = Mp->m_f;
  bVar6 = (byte)-Mp->m_e;
  n = uVar9 >> (bVar6 & 0x1f);
  uVar8 = ~(-1 << (bVar6 & 0x1f));
  uVar7 = uVar9 & uVar8;
  if (n == 0 && uVar7 == 0) {
    __assert_fail("p1 || p2",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/floaxie/floaxie/grisu.h"
                  ,0x87,
                  "static void floaxie::digit_gen_select<false>::gen(const diy_fp<FloatType> &, const diy_fp<FloatType> &, CharType *, int *, int *) [FloatType = float, CharType = char]"
                 );
  }
  *len = 0;
  if (uVar9 >> (bVar6 & 0x1f) != 0) {
    kVar5 = calculate_kappa_div(n);
    if (kVar5.first != '\0') {
      uVar10 = (ulong)kVar5 >> 0x20;
      do {
        uVar2 = kVar5.first;
        iVar11 = *len;
        *len = iVar11 + 1;
        buffer[iVar11] = (char)(n / uVar10) + '0';
        kVar5._0_4_ = kVar5._0_4_ - 1;
        kVar5.second = 0;
        if (uVar2 == '\x01') break;
        n = (uint)((ulong)n % uVar10);
        uVar10 = uVar10 / 10;
      } while (n != 0);
    }
    iVar11 = (int)((ulong)kVar5 & 0xff);
    if (uVar7 <= dVar4.m_f) {
      iVar11 = iVar11 + *K;
      goto LAB_002b442d;
    }
    memset(buffer + *len,0x30,(ulong)kVar5 & 0xff);
    *len = *len + iVar11;
  }
  uVar9 = 0;
  if (dVar4.m_f < uVar7) {
    iVar11 = *len;
    bVar3 = 0;
    do {
      uVar9 = uVar7 * 10 >> (bVar6 & 0x1f);
      if ((0 < iVar11) || ((uVar9 & 0xff) != 0)) {
        iVar1 = *len;
        *len = iVar1 + 1;
        buffer[iVar1] = (char)uVar9 + '0';
      }
      uVar7 = uVar7 * 10 & uVar8;
      bVar3 = bVar3 + 1;
      uVar9 = dVar4.m_f * 10;
      dVar4.m_e = 0;
      dVar4.m_f = uVar9;
    } while (uVar9 < uVar7);
    uVar9 = (uint)bVar3;
  }
  iVar11 = *K - uVar9;
LAB_002b442d:
  *K = iVar11;
  return;
}

Assistant:

inline static void gen(const diy_fp<FloatType>& Mp, const diy_fp<FloatType>& Mm, CharType* buffer, int* len, int* K) noexcept
		{
			assert(Mp.exponent() <= 0);

			const diy_fp<FloatType>& delta(Mp - Mm);

			const diy_fp<FloatType> one(raised_bit<typename diy_fp<FloatType>::mantissa_storage_type>(-Mp.exponent()), Mp.exponent());

			half_of_mantissa_storage_type p1 = Mp.mantissa() >> -one.exponent();
			typename diy_fp<FloatType>::mantissa_storage_type p2 = Mp.mantissa() & (one.mantissa() - 1);

			assert(p1 || p2);

			*len = 0;

			auto delta_f = delta.mantissa();

			const bool close_to_delta = p2 <= delta_f;

			if (p1)
			{
				auto&& kappa_div(calculate_kappa_div(p1));

				unsigned char& kappa(kappa_div.first);
				half_of_mantissa_storage_type& div(kappa_div.second);

				while (kappa > 0 && p1)
				{
					buffer[(*len)++] = '0' + p1 / div;

					p1 %= div;

					kappa--;
					div /= 10;
				}

				if (close_to_delta)
				{
					*K += kappa;
					return;
				}
				else
				{
					wrap::memset(buffer + (*len), CharType('0'), kappa);
					(*len) += kappa;
				}
			}

			const bool some_already_written = (*len) > 0;
			unsigned char kappa(0);

			while (p2 > delta_f)
			{
				p2 *= 10;

				const unsigned char d = p2 >> -one.exponent();

				if (some_already_written || d)
					buffer[(*len)++] = '0' + d;

				p2 &= one.mantissa() - 1;

				++kappa;
				delta_f *= 10;
			}

			*K -= kappa;
		}